

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManPropagate(Cbs2_Man_t *p,int Level)

{
  int v;
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  long lVar6;
  
  do {
    lVar6 = (long)(p->pProp).iHead;
    while ((iVar1 = (p->pProp).iTail, lVar6 < iVar1 && (iVar2 = (p->pProp).pData[lVar6], iVar2 != 0)
           )) {
      iVar1 = Abc_Lit2Var(iVar2);
      iVar1 = Cbs2_ManPropagateOne(p,iVar1,Level);
      lVar6 = lVar6 + 1;
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    (p->pProp).iHead = iVar1;
    iVar1 = (p->pJust).iHead;
    for (lVar6 = (long)iVar1;
        (iVar2 = (p->pJust).iTail, lVar6 < iVar2 && (v = (p->pJust).pData[lVar6], v != 0));
        lVar6 = lVar6 + 1) {
      pGVar4 = Gia_ManObj(p->pAig,v);
      iVar2 = Cbs2_VarIsJust(p,pGVar4,v);
      if (iVar2 == 0) {
        pGVar4 = Gia_ManObj(p->pAig,v);
        if (((ulong)pGVar4 & 1) != 0) {
          __assert_fail("!Gia_IsComplement(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x412,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
        }
        if (((int)(uint)*(undefined8 *)pGVar4 < 0) ||
           (((uint)*(undefined8 *)pGVar4 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("Gia_ObjIsAnd(pVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x413,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
        }
        iVar2 = Cbs2_VarIsAssigned(p,v);
        if (iVar2 == 0) {
          __assert_fail("Cbs2_VarIsAssigned(p, iVar)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x414,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
        }
        iVar2 = Cbs2_VarValue(p,v);
        if (iVar2 != 0) {
          __assert_fail("Cbs2_VarValue(p, iVar) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                        ,0x415,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
        }
        iVar2 = Cbs2_VarFanin0Value(p,pGVar4,v);
        iVar3 = Cbs2_VarFanin1Value(p,pGVar4,v);
        p->nPropCalls[1] = p->nPropCalls[1] + 1;
        if (iVar3 != 0 && iVar2 != 0) {
          if (iVar3 == 1 && iVar2 == 1) {
            iVar2 = Cbs2_ManAnalyze(p,Level,v,v - ((uint)*(undefined8 *)pGVar4 & 0x1fffffff),
                                    v - ((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) & 0x1fffffff))
            ;
            if (iVar2 != 0) {
              return iVar2;
            }
          }
          else {
            if (iVar2 != 1 && iVar3 != 1) {
              __assert_fail("Value0 == 1 || Value1 == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCSat2.c"
                            ,0x41e,"int Cbs2_ManPropagateTwo(Cbs2_Man_t *, int, int)");
            }
            if (1 < iVar2) {
              iVar2 = Gia_ObjFaninLit0(pGVar4,v);
              iVar2 = Abc_LitNot(iVar2);
              Cbs2_ManAssign(p,iVar2,Level,v,v - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
            }
            if (1 < iVar3) {
              iVar2 = Gia_ObjFaninLit1(pGVar4,v);
              iVar2 = Abc_LitNot(iVar2);
              Cbs2_ManAssign(p,iVar2,Level,v,v - (*(uint *)pGVar4 & 0x1fffffff));
            }
          }
        }
      }
      else {
        lVar5 = (long)iVar1;
        iVar1 = iVar1 + 1;
        (p->pJust).pData[lVar5] = v;
      }
    }
    if (iVar1 == iVar2) {
      return 0;
    }
    (p->pJust).iTail = iVar1;
  } while( true );
}

Assistant:

int Cbs2_ManPropagate( Cbs2_Man_t * p, int Level )
{
    while ( 1 )
    {
        int i, k, iVar, iLit, hClause;
        Cbs2_QueForEachEntry( p->pProp, iLit, i )
        {
            if ( (hClause = Cbs2_ManPropagateOne( p, Abc_Lit2Var(iLit), Level )) )
                return hClause;
        }
        p->pProp.iHead = p->pProp.iTail;
        k = p->pJust.iHead;
        Cbs2_QueForEachEntry( p->pJust, iVar, i )
        {
            if ( Cbs2_VarIsJust(p, Gia_ManObj(p->pAig, iVar), iVar) )
                p->pJust.pData[k++] = iVar;
            else if ( (hClause = Cbs2_ManPropagateTwo( p, iVar, Level )) )
                return hClause;
        }
        if ( k == p->pJust.iTail )
            break;
        p->pJust.iTail = k;
    }
    return 0;
}